

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall Buffer_add_buffer_Test::TestBody(Buffer_add_buffer_Test *this)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  buf_00;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  bfy_buffer *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  char *pcVar4;
  AssertionResult AVar5;
  string str;
  size_type expected_size;
  size_t n_expected_vecs;
  bfy_buffer buf;
  BufferWithReadonlyStrings b;
  BufferWithReadonlyStrings a;
  AssertHelper local_260;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  undefined1 local_248 [8];
  AssertHelperData *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  AssertHelper local_228;
  unsigned_long local_220;
  unsigned_long local_218;
  bfy_buffer local_210;
  BufferWithReadonlyStrings local_188;
  BufferWithReadonlyStrings local_c8;
  
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_c8);
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_188);
  sVar2 = bfy_buffer_peek(&local_c8.buf,0xffffffffffffffff,(bfy_iovec *)0x0,0);
  sVar3 = bfy_buffer_peek(&local_188.buf,0xffffffffffffffff,(bfy_iovec *)0x0,0);
  local_218 = sVar3 + sVar2;
  local_220 = local_188.allstrs._M_string_length + local_c8.allstrs._M_string_length;
  bfy_buffer_init();
  local_258._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_258._M_head_impl._4_4_ << 0x20);
  local_260.data_._0_4_ = bfy_buffer_add_buffer(&local_210,&local_c8.buf);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_248,"0","bfy_buffer_add_buffer(&buf, &a.buf)",(int *)&local_258,
             (int *)&local_260);
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_258);
    if (local_240 == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_240;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x386,pcVar4);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    if (local_258._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_258._M_head_impl + 8))();
    }
  }
  if (local_240 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  }
  local_258._M_head_impl = local_258._M_head_impl & 0xffffffff00000000;
  iVar1 = bfy_buffer_add_buffer(&local_210,&local_188.buf);
  local_260.data_._0_4_ = iVar1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_248,"0","bfy_buffer_add_buffer(&buf, &b.buf)",(int *)&local_258,
             (int *)&local_260);
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_258);
    if (local_240 == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_240;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x387,pcVar4);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    if (local_258._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_258._M_head_impl + 8))();
    }
  }
  if (local_240 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  }
  local_258._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bfy_buffer_peek_all(&local_210,(bfy_iovec *)0x0,0);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_248,"n_expected_vecs","bfy_buffer_peek_all(&buf, __null, 0)",
             &local_218,(unsigned_long *)&local_258);
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_258);
    if (local_240 == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_240;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x388,pcVar4);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    if (local_258._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_258._M_head_impl + 8))();
    }
  }
  if (local_240 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  }
  local_258._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bfy_buffer_get_content_len(&local_210);
  AVar5 = testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)local_248,"expected_size","bfy_buffer_get_content_len(&buf)",
                     &local_220,(unsigned_long *)&local_258);
  buf_00._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar5.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_258);
    if (local_240 == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_240;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x389,pcVar4);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    buf_00 = extraout_RDX.
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (local_258._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_258._M_head_impl + 8))();
      buf_00._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)extraout_RDX_00;
    }
  }
  if (local_240 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
    buf_00._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  (anonymous_namespace)::buffer_remove_string_abi_cxx11_
            ((string *)local_248,(_anonymous_namespace_ *)&local_210,
             (bfy_buffer *)buf_00._M_head_impl);
  local_260.data_ = local_240;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_258,"expected_size","std::size(str)",&local_220,
             (unsigned_long *)&local_260);
  if (local_258._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_260);
    if (local_250 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_250->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x38c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if (local_260.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_260.data_ + 8))();
    }
  }
  if (local_250 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_250,local_250);
  }
  bfy_buffer_destruct(&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_248._1_7_,local_248[0]) != &local_238) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_248._1_7_,local_248[0]),local_238._M_allocated_capacity + 1);
  }
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_188);
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_c8);
  return;
}

Assistant:

TEST(Buffer, add_buffer) {
    auto a = BufferWithReadonlyStrings {};
    auto b = BufferWithReadonlyStrings {};
    auto const n_expected_vecs = buffer_count_pages(&a.buf) + buffer_count_pages(&b.buf);
    auto const expected_size = std::size(a.allstrs) + std::size(b.allstrs);

    auto buf = bfy_buffer_init();
    EXPECT_EQ(0, bfy_buffer_add_buffer(&buf, &a.buf));
    EXPECT_EQ(0, bfy_buffer_add_buffer(&buf, &b.buf));
    EXPECT_EQ(n_expected_vecs, bfy_buffer_peek_all(&buf, NULL, 0));
    EXPECT_EQ(expected_size, bfy_buffer_get_content_len(&buf));

    auto const str = buffer_remove_string(&buf);
    EXPECT_EQ(expected_size, std::size(str));

    bfy_buffer_destruct(&buf);
}